

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O1

DWORD __thiscall
FNodeBuilder::PushGLSeg
          (FNodeBuilder *this,TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *segs,
          FPrivSeg *seg,vertex_t *outVerts)

{
  int iVar1;
  int iVar2;
  DWORD DVar3;
  uint uVar4;
  sector_t_conflict *psVar5;
  sector_t_conflict *psVar6;
  glseg_t *pgVar7;
  line_t_conflict *plVar8;
  side_t *psVar9;
  
  iVar1 = seg->v1;
  iVar2 = seg->v2;
  psVar5 = seg->frontsector;
  psVar6 = seg->backsector;
  if ((long)seg->linedef == -1) {
    psVar9 = (side_t *)0x0;
    plVar8 = (line_t_conflict *)0x0;
  }
  else {
    plVar8 = this->Level->Lines + seg->linedef;
    psVar9 = this->Level->Sides + seg->sidedef;
  }
  DVar3 = seg->partner;
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::Grow(segs,1);
  pgVar7 = segs->Array;
  uVar4 = segs->Count;
  pgVar7[uVar4].super_seg_t.v1 = outVerts + iVar1;
  pgVar7[uVar4].super_seg_t.v2 = outVerts + iVar2;
  pgVar7[uVar4].super_seg_t.sidedef = psVar9;
  pgVar7[uVar4].super_seg_t.linedef = plVar8;
  pgVar7[uVar4].super_seg_t.frontsector = psVar5;
  pgVar7[uVar4].super_seg_t.backsector = psVar6;
  pgVar7[uVar4].Partner = DVar3;
  DVar3 = segs->Count;
  segs->Count = DVar3 + 1;
  return DVar3;
}

Assistant:

DWORD FNodeBuilder::PushGLSeg (TArray<glseg_t> &segs, const FPrivSeg *seg, vertex_t *outVerts)
{
	glseg_t newseg;

	newseg.v1 = outVerts + seg->v1;
	newseg.v2 = outVerts + seg->v2;
	newseg.backsector = seg->backsector;
	newseg.frontsector = seg->frontsector;
	if (seg->linedef != -1)
	{
		newseg.linedef = Level.Lines + seg->linedef;
		newseg.sidedef = Level.Sides + seg->sidedef;
	}
	else
	{
		newseg.linedef = NULL;
		newseg.sidedef = NULL;
	}
	newseg.Partner = seg->partner;
	return (DWORD)segs.Push (newseg);
}